

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

void * crnd::crnd_realloc(void *p,size_t size,size_t *pActual_size,bool movable)

{
  void *p_new;
  size_t actual_size;
  size_t *psStack_28;
  bool movable_local;
  size_t *pActual_size_local;
  size_t size_local;
  void *p_local;
  
  actual_size._7_1_ = movable;
  psStack_28 = pActual_size;
  pActual_size_local = (size_t *)size;
  size_local = (size_t)p;
  if (((ulong)p & 7) == 0) {
    if (size < 0x7fff0001) {
      p_new = (void *)size;
      p_local = (void *)(*(code *)g_pRealloc)(p,size,&p_new,movable,g_pUser_data);
      if (psStack_28 != (size_t *)0x0) {
        *psStack_28 = (size_t)p_new;
      }
    }
    else {
      crnd_mem_error("crnd_malloc: size too big");
      p_local = (void *)0x0;
    }
  }
  else {
    crnd_mem_error("crnd_realloc: bad ptr");
    p_local = (void *)0x0;
  }
  return p_local;
}

Assistant:

void* crnd_realloc(void* p, size_t size, size_t* pActual_size, bool movable)
    {
        if ((uint32)reinterpret_cast<uintptr_t>(p) & (CRND_MIN_ALLOC_ALIGNMENT - 1))
        {
            crnd_mem_error("crnd_realloc: bad ptr");
            return NULL;
        }

        if (size > MAX_POSSIBLE_BLOCK_SIZE)
        {
            crnd_mem_error("crnd_malloc: size too big");
            return NULL;
        }

        size_t actual_size = size;
        void* p_new = (*g_pRealloc)(p, size, &actual_size, movable, g_pUser_data);

        if (pActual_size)
            *pActual_size = actual_size;

        CRND_ASSERT(((uint32) reinterpret_cast<uintptr_t>(p_new) & (CRND_MIN_ALLOC_ALIGNMENT - 1)) == 0);

        return p_new;
    }